

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

string * __thiscall Matrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ostringstream out;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"\\begin{bmatrix}");
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar3 = 0;
  while ((long)uVar3 < (long)this->n_) {
    lVar2 = 0;
    uVar4 = 0;
    while ((long)uVar4 < (long)this->m_) {
      Fraction::ToLaTex_abi_cxx11_
                (&local_1c8,
                 (Fraction *)
                 (*(long *)&(this->elements_).
                            super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar3].
                            super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                            super__Vector_impl_data + lVar2));
      std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      uVar4 = uVar4 + 1;
      if (uVar4 != (uint)this->m_) {
        std::operator<<((ostream *)local_1a8," & ");
      }
      lVar2 = lVar2 + 8;
    }
    uVar3 = uVar3 + 1;
    if (uVar3 != (uint)this->n_) {
      std::operator<<((ostream *)local_1a8," \\\\");
    }
    std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
  }
  std::operator<<((ostream *)local_1a8,"\\end{bmatrix}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int i = 0; i < n_; ++i) {
    for (int j = 0; j < m_; ++j) {
      out << elements_[i][j].ToLaTex();
      if (j + 1 != m_) {
        out << " & ";
      }
    }
    if (i + 1 != n_) {
      out << " \\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}